

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_handle_seq_blck(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  csubstr val;
  csubstr s_00;
  bool bVar9;
  undefined1 uVar10;
  char cVar11;
  int iVar12;
  size_t sVar13;
  State *pSVar14;
  uint uVar15;
  long lVar16;
  size_t *psVar17;
  char *pcVar18;
  basic_substring<const_char> *pbVar19;
  byte bVar20;
  ro_substr chars;
  csubstr fmt;
  csubstr rem;
  ro_substr pattern;
  ro_substr chars_00;
  bool is_quoted;
  char msg [30];
  csubstr s;
  bool local_189;
  basic_substring<const_char> local_188;
  basic_substring<const_char> local_178;
  undefined4 uStack_168;
  undefined2 uStack_164;
  undefined1 uStack_162;
  undefined1 uStack_161;
  undefined4 uStack_160;
  undefined2 uStack_15c;
  undefined1 uStack_15a;
  undefined4 uStack_159;
  undefined5 uStack_155;
  undefined2 local_138;
  csubstr local_128;
  undefined8 local_118;
  char *pcStack_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  char *pcStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  char *pcStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  char *pcStack_48;
  undefined8 local_40;
  basic_substring<const_char> local_38;
  basic_substring<const_char> local_28;
  
  bVar20 = 0;
  pSVar14 = this->m_state;
  local_188.str = (pSVar14->line_contents).rem.str;
  local_188.len = (pSVar14->line_contents).rem.len;
  uVar15 = pSVar14->flags;
  if ((uVar15 & 8) == 0) {
    uStack_168 = 0x615f7361;
    uStack_164 = 0x6c6c;
    uStack_162 = 0x28;
    uStack_161 = 0x52;
    uStack_160 = 0x29514553;
    uStack_15c = 0x29;
    local_178.str = (char *)0x6166206b63656863;
    local_178.len._0_4_ = 0x64656c69;
    local_178.len._4_2_ = 0x203a;
    local_178.len._6_1_ = 0x28;
    local_178.len._7_1_ = 0x68;
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar1 = (code *)swi(3);
      uVar10 = (*pcVar1)();
      return (bool)uVar10;
    }
    local_60 = 0;
    uStack_58 = 0x6e2d;
    local_50 = 0;
    pcStack_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_40 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x6e2d) << 0x40);
    LVar2.name.str._0_4_ = 0x1fa88a;
    LVar2.super_LineCol.offset = auVar3._0_8_;
    LVar2.super_LineCol.line = auVar3._8_8_;
    LVar2.super_LineCol.col = auVar3._16_8_;
    LVar2.name.str._4_4_ = 0;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_178,0x1e,LVar2,(this->m_stack).m_callbacks.m_user_data);
    uVar15 = this->m_state->flags;
  }
  if ((uVar15 & 0x40) != 0) {
    uStack_168 = 0x6e5f7361;
    uStack_164 = 0x6e6f;
    uStack_162 = 0x65;
    uStack_161 = 0x28;
    uStack_160 = 0x59454b52;
    uStack_15c = 0x2929;
    uStack_15a = 0;
    local_178.str = (char *)0x6166206b63656863;
    local_178.len._0_4_ = 0x64656c69;
    local_178.len._4_2_ = 0x203a;
    local_178.len._6_1_ = 0x28;
    local_178.len._7_1_ = 0x68;
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar1 = (code *)swi(3);
      uVar10 = (*pcVar1)();
      return (bool)uVar10;
    }
    local_88 = 0;
    uStack_80 = 0x6e2e;
    local_78 = 0;
    pcStack_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_68 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x6e2e) << 0x40);
    LVar4.name.str._0_4_ = 0x1fa88a;
    LVar4.super_LineCol.offset = auVar3._0_8_;
    LVar4.super_LineCol.line = auVar3._8_8_;
    LVar4.super_LineCol.col = auVar3._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_178,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
    uVar15 = this->m_state->flags;
  }
  if ((uVar15 & 0x10) != 0) {
    uStack_168 = 0x6e5f7361;
    uStack_164 = 0x6e6f;
    uStack_162 = 0x65;
    uStack_161 = 0x28;
    uStack_160 = 0x574f4c46;
    uStack_15c = 0x2929;
    uStack_15a = 0;
    local_178.str = (char *)0x6166206b63656863;
    local_178.len._0_4_ = 0x64656c69;
    local_178.len._4_2_ = 0x203a;
    local_178.len._6_1_ = 0x28;
    local_178.len._7_1_ = 0x68;
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar1 = (code *)swi(3);
      uVar10 = (*pcVar1)();
      return (bool)uVar10;
    }
    local_b0 = 0;
    uStack_a8 = 0x6e2f;
    local_a0 = 0;
    pcStack_98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_90 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x6e2f) << 0x40);
    LVar5.name.str._0_4_ = 0x1fa88a;
    LVar5.super_LineCol.offset = auVar3._0_8_;
    LVar5.super_LineCol.line = auVar3._8_8_;
    LVar5.super_LineCol.col = auVar3._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_178,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((local_188.len != 0) && (*local_188.str == '#')) {
    _scan_comment(this);
    return true;
  }
  uVar15 = this->m_state->flags;
  cVar11 = (char)uVar15;
  if ((uVar15 >> 8 & 1) == 0) {
    if (-1 < cVar11) {
      return false;
    }
    bVar9 = _handle_indentation(this);
    if (bVar9) {
      return true;
    }
    local_128.str = (char *)0x0;
    local_128.len = 0;
    bVar9 = _scan_scalar_seq_blck(this,&local_128,&local_189);
    sVar13 = local_188.len;
    if (bVar9) {
      local_188.str = (this->m_state->line_contents).rem.str;
      local_188.len = (this->m_state->line_contents).rem.len;
      if (local_188.len == 0) {
LAB_001cd21e:
        val.len = local_128.len;
        val.str = local_128.str;
        _append_val(this,val,(uint)local_189);
        this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
        return true;
      }
      cVar11 = *local_188.str;
      if (cVar11 == ' ') {
        sVar13 = basic_substring<const_char>::first_not_of(&local_188,' ',0);
        if (sVar13 == 0xffffffffffffffff) {
          sVar13 = local_188.len;
        }
        _line_progressed(this,sVar13);
        if (local_188.len < sVar13) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar1 = (code *)swi(3);
            uVar10 = (*pcVar1)();
            return (bool)uVar10;
          }
          handle_error(0x1fa937,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_178,local_188.str + sVar13,local_188.len - sVar13);
        local_188.len =
             CONCAT17(local_178.len._7_1_,
                      CONCAT16(local_178.len._6_1_,
                               CONCAT24(local_178.len._4_2_,(undefined4)local_178.len)));
        local_188.str = local_178.str;
        if (local_188.len == 0) goto LAB_001cd21e;
        cVar11 = *local_178.str;
      }
      if ((cVar11 == '#') ||
         ((local_188.str[local_188.len - 1] != ':' &&
          ((cVar11 != ':' || local_188.len == 1 || (local_188.str[1] != ' ')))))) goto LAB_001cd21e;
      if (((this->m_key_anchor).len == 0) || ((this->m_key_anchor).str == (char *)0x0)) {
        _move_val_anchor_to_key_anchor(this);
      }
      if (((this->m_key_tag).len == 0) || ((this->m_key_tag).str == (char *)0x0)) {
        _move_val_tag_to_key_tag(this);
      }
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _push_level(this,false);
      _start_map(this,true);
      s_00.len = local_128.len;
      s_00.str = local_128.str;
      _store_scalar(this,s_00,(uint)local_189);
      if ((((this->m_key_anchor).len == 0) ||
          (lVar16 = 0xa48, (this->m_key_anchor).str == (char *)0x0)) &&
         (((this->m_key_tag).len == 0 || (lVar16 = 0x9f8, (this->m_key_tag).str == (char *)0x0)))) {
        pSVar14 = this->m_state;
        psVar17 = &pSVar14->scalar_col;
      }
      else {
        psVar17 = (size_t *)((long)(this->m_stack).m_buf + lVar16 + -0x38);
        pSVar14 = this->m_state;
      }
      pSVar14->indref = *psVar17;
      if (((this->m_key_tag2).len != 0) && ((this->m_key_tag2).str != (char *)0x0)) {
        sVar13 = (this->m_key_tag2).len;
        (this->m_key_tag).str = (this->m_key_tag2).str;
        (this->m_key_tag).len = sVar13;
        this->m_key_tag_indentation = this->m_key_tag2_indentation;
        (this->m_key_tag2).str = (char *)0x0;
        (this->m_key_tag2).len = 0;
        this->m_key_tag2_indentation = 0;
      }
      uVar15 = 0xffffff3f;
      goto LAB_001cd560;
    }
    if (((1 < local_188.len) && (*local_188.str == '-')) && (local_188.str[1] == ' ')) {
      bVar9 = _rval_dash_start_or_continue_seq(this);
      if (!bVar9) {
        return true;
      }
      goto LAB_001cd346;
    }
    iVar12 = basic_substring<const_char>::compare(&local_188,'-');
    if (iVar12 != 0) {
      if (sVar13 == 0) {
LAB_001cd8c9:
        bVar9 = _handle_types(this);
        if (bVar9) {
          return true;
        }
        bVar9 = _handle_val_anchors_and_refs(this);
        if (bVar9) {
          return true;
        }
        if (((uint)this->m_state->flags >> 9 & 1) != 0) {
LAB_001cda11:
          bVar9 = is_debugger_attached();
          if ((bVar9) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar1 = (code *)swi(3);
            uVar10 = (*pcVar1)();
            return (bool)uVar10;
          }
LAB_001cd642:
          fmt.len = 0x12;
          fmt.str = "ERROR: parse error";
          _err<>(this,fmt);
          return false;
        }
        if (((local_188.len < 2) || (*local_188.str != ':')) || (local_188.str[1] != ' ')) {
          pattern.len = 1;
          pattern.str = "#";
          sVar13 = basic_substring<const_char>::find(&local_188,pattern,0);
          if ((sVar13 != 0xffffffffffffffff) && (local_188.len < sVar13)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar1 = (code *)swi(3);
              uVar10 = (*pcVar1)();
              return (bool)uVar10;
            }
            handle_error(0x1fa937,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1569,"pos <= len || pos == npos");
          }
          if (sVar13 == 0xffffffffffffffff) {
            local_178.str = local_188.str;
            local_178.len._0_4_ = (undefined4)local_188.len;
            local_178.len._4_2_ = (undefined2)(local_188.len >> 0x20);
            local_178.len._6_1_ = (undefined1)(local_188.len >> 0x30);
            local_178.len._7_1_ = (undefined1)(local_188.len >> 0x38);
          }
          else {
            basic_substring<const_char>::basic_substring(&local_178,local_188.str,sVar13);
          }
          local_38.len = CONCAT17(local_178.len._7_1_,
                                  CONCAT16(local_178.len._6_1_,
                                           CONCAT24(local_178.len._4_2_,(undefined4)local_178.len)))
          ;
          local_38.str = local_178.str;
          chars_00.len = 1;
          chars_00.str = "\t";
          local_28 = basic_substring<const_char>::trimr(&local_38,chars_00);
          iVar12 = basic_substring<const_char>::compare(&local_28,":",1);
          if (iVar12 != 0) goto LAB_001cda11;
        }
        if (((this->m_val_anchor).len == 0) || ((this->m_val_anchor).str == (char *)0x0)) {
          pSVar14 = this->m_state;
          if (((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0))
          goto LAB_001cdb29;
          pSVar14->flags = pSVar14->flags & 0xfffffe7fU | 0x100;
          sVar13 = pSVar14->indref;
          _push_level(this,false);
          _start_map(this,true);
          _store_scalar_null(this,local_188.str);
          pSVar14 = this->m_state;
          pSVar14->flags = pSVar14->flags & 0xffffff3fU | 0x80;
          pSVar14->indref = sVar13 + 2;
        }
        else {
          pSVar14 = this->m_state;
LAB_001cdb29:
          pSVar14->flags = pSVar14->flags & 0xfffffe7fU | 0x100;
          _move_val_tag_to_key_tag(this);
          _move_val_anchor_to_key_anchor(this);
          _push_level(this,false);
          _start_map(this,true);
          _store_scalar_null(this,local_188.str);
          pSVar14 = this->m_state;
          pSVar14->flags = pSVar14->flags & 0xffffff3fU | 0x80;
          if ((((this->m_key_anchor).len == 0) ||
              (lVar16 = 0xa48, (this->m_key_anchor).str == (char *)0x0)) &&
             (((this->m_key_tag).len == 0 || (lVar16 = 0x9f8, (this->m_key_tag).str == (char *)0x0))
             )) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar1 = (code *)swi(3);
              uVar10 = (*pcVar1)();
              return (bool)uVar10;
            }
            local_178.str = (char *)0x0;
            local_178.len._0_4_ = 0x6eed;
            local_178.len._4_2_ = 0;
            local_178.len._6_1_ = 0;
            local_178.len._7_1_ = 0;
            uStack_168 = 0;
            uStack_164 = 0;
            uStack_162 = 0;
            uStack_161 = 0;
            uStack_160 = 0x1fa88a;
            uStack_15c = 0;
            uStack_15a = 0;
            uStack_159 = 0x6500;
            uStack_155 = 0;
            (*(code *)PTR_error_impl_0023c518)
                      ("check failed: _maybe_set_indentation_from_anchor_or_tag()",0x39,
                       (anonymous_namespace)::s_default_callbacks);
          }
          else {
            pSVar14->indref = *(size_t *)((long)(this->m_stack).m_buf + lVar16 + -0x38);
          }
        }
        sVar13 = 1;
        if ((1 < local_188.len) && (*local_188.str == ':')) {
          sVar13 = (ulong)(local_188.str[1] == ' ') + 1;
        }
        goto LAB_001cd572;
      }
      cVar11 = *local_188.str;
      if (cVar11 != '{') {
        if (cVar11 == '[') {
          this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
          _push_level(this,true);
          _start_seq(this,true);
          this->m_state->flags = this->m_state->flags | 0x10;
          goto LAB_001cd56a;
        }
        if (cVar11 == '?' && 1 < sVar13) {
          if (local_188.str[1] == ' ') {
            this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
            _push_level(this,false);
            _start_map(this,true);
            this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x60;
            _save_indentation(this,0);
            goto LAB_001cd346;
          }
        }
        else if (cVar11 == ' ') {
          sVar13 = basic_substring<const_char>::first_not_of(&local_188,' ',0);
          if ((sVar13 != 0xffffffffffffffff) && (local_188.len < sVar13)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar1 = (code *)swi(3);
              uVar10 = (*pcVar1)();
              return (bool)uVar10;
            }
            handle_error(0x1fa937,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1569,"pos <= len || pos == npos");
          }
          if (sVar13 == 0xffffffffffffffff) {
            local_178.str = local_188.str;
            local_178.len._0_4_ = (undefined4)local_188.len;
            local_178.len._4_2_ = (undefined2)(local_188.len >> 0x20);
            local_178.len._6_1_ = (undefined1)(local_188.len >> 0x30);
            local_178.len._7_1_ = (undefined1)(local_188.len >> 0x38);
          }
          else {
            basic_substring<const_char>::basic_substring(&local_178,local_188.str,sVar13);
          }
          sVar13 = CONCAT17(local_178.len._7_1_,
                            CONCAT16(local_178.len._6_1_,
                                     CONCAT24(local_178.len._4_2_,(undefined4)local_178.len)));
          goto LAB_001cd572;
        }
        goto LAB_001cd8c9;
      }
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _push_level(this,true);
      _start_map(this,true);
      pSVar14 = this->m_state;
      uVar15 = pSVar14->flags & 0xffffff2fU | 0x50;
      goto LAB_001cd568;
    }
    bVar9 = _rval_dash_start_or_continue_seq(this);
    if (!bVar9) {
      return true;
    }
  }
  else {
    if (cVar11 < '\0') {
      uStack_168 = 0x6e5f7361;
      uStack_164 = 0x6e6f;
      uStack_162 = 0x65;
      uStack_161 = 0x28;
      uStack_160 = 0x4c415652;
      uStack_15c = 0x2929;
      uStack_15a = 0;
      local_178.str = (char *)0x6166206b63656863;
      local_178.len._0_4_ = 0x64656c69;
      local_178.len._4_2_ = 0x203a;
      local_178.len._6_1_ = 0x28;
      local_178.len._7_1_ = 0x68;
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar1 = (code *)swi(3);
        uVar10 = (*pcVar1)();
        return (bool)uVar10;
      }
      local_d8 = 0;
      uStack_d0 = 0x6e39;
      local_c8 = 0;
      pcStack_c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_b8 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x6e39) << 0x40);
      LVar6.name.str._0_4_ = 0x1fa88a;
      LVar6.super_LineCol.offset = auVar3._0_8_;
      LVar6.super_LineCol.line = auVar3._8_8_;
      LVar6.super_LineCol.col = auVar3._16_8_;
      LVar6.name.str._4_4_ = 0;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_178,0x1f,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar9 = _handle_indentation(this);
    sVar13 = local_188.len;
    if (bVar9) {
      return true;
    }
    if (((1 < local_188.len) && (*local_188.str == '-')) && (local_188.str[1] == ' ')) {
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x80;
LAB_001cd346:
      sVar13 = 2;
      goto LAB_001cd572;
    }
    iVar12 = basic_substring<const_char>::compare(&local_188,'-');
    if (iVar12 != 0) {
      if (sVar13 != 0) {
        if ((*local_188.str == '\t') || (*local_188.str == ' ')) {
          pSVar14 = this->m_state;
          if ((pSVar14->line_contents).rem.str == (pSVar14->line_contents).full.str) {
            uStack_168 = 0x74615f20;
            uStack_164 = 0x6c5f;
            uStack_162 = 0x69;
            uStack_161 = 0x6e;
            uStack_160 = 0x65625f65;
            uStack_15c = 0x6967;
            uStack_15a = 0x6e;
            local_178.str = (char *)0x6166206b63656863;
            local_178.len._0_4_ = 0x64656c69;
            local_178.len._4_2_ = 0x203a;
            local_178.len._6_1_ = 0x28;
            local_178.len._7_1_ = 0x21;
            uStack_159 = 0x292928;
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar1 = (code *)swi(3);
              uVar10 = (*pcVar1)();
              return (bool)uVar10;
            }
            local_100 = 0;
            uStack_f8 = 0x6e4e;
            local_f0 = 0;
            pcStack_e8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_e0 = 0x65;
            auVar3 = ZEXT1224(ZEXT412(0x6e4e) << 0x40);
            LVar7.name.str._0_4_ = 0x1fa88a;
            LVar7.super_LineCol.offset = auVar3._0_8_;
            LVar7.super_LineCol.line = auVar3._8_8_;
            LVar7.super_LineCol.col = auVar3._16_8_;
            LVar7.name.str._4_4_ = 0;
            LVar7.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_178,0x23,LVar7,(this->m_stack).m_callbacks.m_user_data);
            pSVar14 = this->m_state;
          }
          if (((pSVar14->line_contents).rem.len == 0) ||
             ((cVar11 = *(pSVar14->line_contents).rem.str, cVar11 != '\t' && (cVar11 != ' ')))) {
            pcVar18 = "check failed: (m_state->line_contents.rem.begins_with_any(chars))";
            pbVar19 = &local_178;
            for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
              pbVar19->str = *(char **)pcVar18;
              pcVar18 = pcVar18 + ((ulong)bVar20 * -2 + 1) * 8;
              pbVar19 = (basic_substring<const_char> *)&pbVar19[-(ulong)bVar20].len;
            }
            local_138 = 0x29;
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar1 = (code *)swi(3);
              uVar10 = (*pcVar1)();
              return (bool)uVar10;
            }
            local_128.str = (char *)0x0;
            local_128.len = 0x6d71;
            local_118 = 0;
            pcStack_110 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_108 = 0x65;
            auVar3 = ZEXT1224(ZEXT412(0x6d71) << 0x40);
            LVar8.name.str._0_4_ = 0x1fa88a;
            LVar8.super_LineCol.offset = auVar3._0_8_;
            LVar8.super_LineCol.line = auVar3._8_8_;
            LVar8.super_LineCol.col = auVar3._16_8_;
            LVar8.name.str._4_4_ = 0;
            LVar8.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_178,0x42,LVar8,(this->m_stack).m_callbacks.m_user_data);
            pSVar14 = this->m_state;
          }
          chars.len = 2;
          chars.str = " \t";
          sVar13 = basic_substring<const_char>::first_not_of(&(pSVar14->line_contents).rem,chars,0);
          if (sVar13 == 0xffffffffffffffff) {
            sVar13 = (this->m_state->line_contents).rem.len;
          }
          goto LAB_001cd572;
        }
        if (2 < sVar13) {
          lVar16 = 0;
LAB_001cd757:
          if (local_188.str[lVar16] == "\t..."[lVar16 + 1]) goto code_r0x001cd75f;
          lVar16 = 0;
          while (local_188.str[lVar16] == "---"[lVar16]) {
            lVar16 = lVar16 + 1;
            if (lVar16 == 3) {
              rem.len = sVar13;
              rem.str = local_188.str;
              _start_new_doc(this,rem);
              return true;
            }
          }
        }
      }
      bVar9 = is_debugger_attached();
      if ((bVar9) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar1 = (code *)swi(3);
        uVar10 = (*pcVar1)();
        return (bool)uVar10;
      }
      goto LAB_001cd642;
    }
    pSVar14 = this->m_state;
    uVar15 = 0xfffffe7f;
LAB_001cd560:
    uVar15 = uVar15 & pSVar14->flags | 0x80;
LAB_001cd568:
    pSVar14->flags = uVar15;
  }
LAB_001cd56a:
  sVar13 = 1;
LAB_001cd572:
  _line_progressed(this,sVar13);
  return true;
code_r0x001cd75f:
  lVar16 = lVar16 + 1;
  if (lVar16 == 3) goto code_r0x001cd768;
  goto LAB_001cd757;
code_r0x001cd768:
  _end_stream(this);
  sVar13 = 3;
  goto LAB_001cd572;
}

Assistant:

bool Parser::_handle_seq_blck()
{
    _c4dbgpf("handle_seq_impl: node_id={} level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));

    if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment();
        return true;
    }
    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        if(_handle_indentation())
            return true;

        if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            _c4dbgp("expect another val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            _c4dbgp("expect another val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
            _skipchars(" \t");
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("got stream end '...'");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else if(rem.begins_with("---"))
        {
            _c4dbgp("got document start '---'");
            _start_new_doc(rem);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RVAL))
    {
        // there can be empty values
        if(_handle_indentation())
            return true;

        csubstr s;
        bool is_quoted;
        if(_scan_scalar_seq_blck(&s, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");

            rem = m_state->line_contents.rem;
            if(_RYML_WITH_OR_WITHOUT_TAB_TOKENS(rem.begins_with_any(" \t"), rem.begins_with(' ')))
            {
                _c4dbgp("skipping whitespace...");
                size_t skip = rem.first_not_of(_RYML_WITH_OR_WITHOUT_TAB_TOKENS(" \t", ' '));
                if(skip == csubstr::npos)
                    skip = rem.len; // maybe the line is just whitespace
                _line_progressed(skip);
                rem = rem.sub(skip);
            }

            _c4dbgpf("rem=[{}]~~~{}~~~", rem.len, rem);
            if(!rem.begins_with('#') && (rem.ends_with(':') || rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t"))))
            {
                _c4dbgp("actually, the scalar is the first key of a map, and it opens a new scope");
                if(m_key_anchor.empty())
                    _move_val_anchor_to_key_anchor();
                if(m_key_tag.empty())
                    _move_val_tag_to_key_tag();
                addrem_flags(RNXT, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _start_map();
                _store_scalar(s, is_quoted);
                if( ! _maybe_set_indentation_from_anchor_or_tag())
                {
                    _c4dbgpf("set indentation from scalar: {}", m_state->scalar_col);
                    _set_indentation(m_state->scalar_col); // this is the column where the scalar starts
                }
                _move_key_tag2_to_key_tag();
                addrem_flags(RVAL, RKEY);
                _line_progressed(1);
            }
            else
            {
                _c4dbgp("appending val to current seq");
                _append_val(s, is_quoted);
                addrem_flags(RNXT, RVAL);
            }
            return true;
        }
        else if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            if(_rval_dash_start_or_continue_seq())
                _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            if(_rval_dash_start_or_continue_seq())
                _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq, flow");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map, flow");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with("? "))
        {
            _c4dbgp("val is a child map + this key is complex");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level();
            _start_map();
            addrem_flags(QMRK|RKEY, RVAL);
            _save_indentation();
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(' '))
        {
            csubstr spc = rem.left_of(rem.first_not_of(' '));
            if(_at_line_begin())
            {
                _c4dbgpf("skipping value indentation: {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
            else
            {
                _c4dbgpf("skipping {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        /* pathological case:
         * - &key : val
         * - &key :
         * - : val
         */
        else if((!has_all(SSCL)) &&
                (rem.begins_with(": ") || rem.left_of(rem.find("#")).trimr("\t") == ":"))
        {
            if(!m_val_anchor.empty() || !m_val_tag.empty())
            {
                _c4dbgp("val is a child map + this key is empty, with anchors or tags");
                addrem_flags(RNXT, RVAL); // before _push_level!
                _move_val_tag_to_key_tag();
                _move_val_anchor_to_key_anchor();
                _push_level();
                _start_map();
                _store_scalar_null(rem.str);
                addrem_flags(RVAL, RKEY);
                RYML_CHECK(_maybe_set_indentation_from_anchor_or_tag()); // one of them must exist
                _line_progressed(rem.begins_with(": ") ? 2u : 1u);
                return true;
            }
            else
            {
                _c4dbgp("val is a child map + this key is empty, no anchors or tags");
                addrem_flags(RNXT, RVAL); // before _push_level!
                size_t ind = m_state->indref;
                _push_level();
                _start_map();
                _store_scalar_null(rem.str);
                addrem_flags(RVAL, RKEY);
                _c4dbgpf("set indentation from map anchor: {}", ind + 2);
                _set_indentation(ind + 2); // this is the column where the map starts
                _line_progressed(rem.begins_with(": ") ? 2u : 1u);
                return true;
            }
        }
        else
        {
            _c4err("parse error");
        }
    }

    return false;
}